

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  char *pcVar2;
  Ch *pCVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  undefined4 uVar7;
  long lVar8;
  uint i;
  byte bVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  ulong i_00;
  byte *pbVar15;
  byte *pbVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double d;
  
  pcVar2 = is->src_;
  pCVar3 = is->head_;
  cVar1 = *pcVar2;
  pbVar16 = (byte *)(pcVar2 + (cVar1 == '-'));
  bVar9 = pcVar2[cVar1 == '-'];
  if (bVar9 == 0x30) {
    pbVar15 = pbVar16 + 1;
    bVar6 = false;
    iVar10 = 0;
    uVar11 = 0;
    i = 0;
    goto LAB_00157edb;
  }
  if ((byte)(bVar9 - 0x31) < 9) {
    i = bVar9 - 0x30;
    uVar11 = (uint)pbVar16[1];
    pbVar15 = pbVar16 + 1;
    bVar9 = pbVar16[1] - 0x30;
    if (cVar1 == '-') {
      if (bVar9 < 10) {
        iVar10 = 0;
        do {
          if ((0xccccccb < i) && ('8' < (char)uVar11 || i != 0xccccccc)) goto LAB_00157ed3;
          i = (uVar11 + i * 10) - 0x30;
          iVar10 = iVar10 + 1;
          pbVar16 = pbVar15 + 1;
          uVar11 = (uint)*pbVar16;
          pbVar15 = pbVar15 + 1;
        } while ((byte)(*pbVar16 - 0x30) < 10);
      }
      else {
LAB_0015843f:
        iVar10 = 0;
      }
    }
    else {
      if (9 < bVar9) goto LAB_0015843f;
      iVar10 = 0;
      do {
        if ((0x19999998 < i) && ('5' < (char)uVar11 || i != 0x19999999)) goto LAB_00157ed3;
        i = (uVar11 + i * 10) - 0x30;
        iVar10 = iVar10 + 1;
        pbVar16 = pbVar15 + 1;
        uVar11 = (uint)*pbVar16;
        pbVar15 = pbVar15 + 1;
      } while ((byte)(*pbVar16 - 0x30) < 10);
    }
    bVar6 = false;
    uVar11 = 0;
    goto LAB_00157edb;
  }
  lVar8 = (long)pbVar16 - (long)pCVar3;
  uVar7 = 3;
  goto LAB_0015844e;
LAB_00157ed3:
  bVar6 = true;
  uVar11 = i;
LAB_00157edb:
  i_00 = (ulong)uVar11;
  dVar21 = 0.0;
  if (bVar6) {
    bVar9 = *pbVar15;
    bVar13 = bVar9 - 0x30;
    if (cVar1 == '-') {
      while (bVar13 < 10) {
        if ((0xccccccccccccccb < i_00) && (i_00 != 0xccccccccccccccc || '8' < (char)bVar9))
        goto LAB_00157fb8;
        i_00 = (ulong)(bVar9 & 0xf) + i_00 * 10;
        iVar10 = iVar10 + 1;
        bVar9 = pbVar15[1];
        pbVar15 = pbVar15 + 1;
        bVar13 = bVar9 - 0x30;
      }
    }
    else {
      while (bVar13 < 10) {
        if ((0x1999999999999998 < i_00) && (i_00 != 0x1999999999999999 || '5' < (char)bVar9))
        goto LAB_00157fb8;
        i_00 = (ulong)(bVar9 & 0xf) + i_00 * 10;
        iVar10 = iVar10 + 1;
        bVar9 = pbVar15[1];
        pbVar15 = pbVar15 + 1;
        bVar13 = bVar9 - 0x30;
      }
    }
  }
  bVar4 = false;
  goto LAB_00157fe1;
LAB_00157fb8:
  auVar18._8_4_ = (int)(i_00 >> 0x20);
  auVar18._0_8_ = i_00;
  auVar18._12_4_ = 0x45300000;
  dVar21 = (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
  bVar4 = true;
LAB_00157fe1:
  if (bVar4) {
    bVar9 = *pbVar15;
    while ((byte)(bVar9 - 0x30) < 10) {
      dVar21 = dVar21 * 10.0 + (double)(int)(bVar9 - 0x30);
      pbVar16 = pbVar15 + 1;
      pbVar15 = pbVar15 + 1;
      bVar9 = *pbVar16;
    }
  }
  pbVar16 = pbVar15 + (*pbVar15 == 0x2e);
  iVar14 = 0;
  if (*pbVar15 == 0x2e) {
    if (0xf5 < (byte)(*pbVar16 - 0x3a)) {
      iVar14 = 0;
      if (!bVar4) {
        uVar12 = (ulong)i;
        if (bVar6) {
          uVar12 = i_00;
        }
        i_00 = uVar12;
        bVar9 = *pbVar16;
        iVar14 = 0;
        if ((0xf5 < (byte)(bVar9 - 0x3a)) && (i_00 < 0x20000000000000)) {
          lVar8 = 0;
          do {
            i_00 = (ulong)(bVar9 & 0xf) + i_00 * 10;
            iVar10 = (uint)(i_00 != 0) + iVar10;
            bVar9 = pbVar16[lVar8 + 1];
            lVar8 = lVar8 + 1;
            if ((byte)(bVar9 - 0x3a) < 0xf6) break;
          } while (i_00 < 0x20000000000000);
          iVar14 = -(int)lVar8;
          pbVar16 = pbVar16 + lVar8;
        }
        auVar19._8_4_ = (int)(i_00 >> 0x20);
        auVar19._0_8_ = i_00;
        auVar19._12_4_ = 0x45300000;
        dVar21 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
        bVar4 = true;
      }
      bVar9 = *pbVar16;
      while ((byte)(bVar9 - 0x30) < 10) {
        if (iVar10 < 0x11) {
          dVar21 = (double)(int)(bVar9 - 0x30) + dVar21 * 10.0;
          iVar14 = iVar14 + -1;
          if (0.0 < dVar21) {
            iVar10 = iVar10 + 1;
          }
        }
        pbVar15 = pbVar16 + 1;
        pbVar16 = pbVar16 + 1;
        bVar9 = *pbVar15;
      }
      goto LAB_00158155;
    }
    lVar8 = (long)pbVar16 - (long)pCVar3;
    uVar7 = 0xe;
  }
  else {
LAB_00158155:
    lVar8 = (long)pcVar2 - (long)pCVar3;
    bVar9 = *pbVar16;
    pbVar16 = pbVar16 + (bVar9 == 0x65);
    if (bVar9 == 0x65) {
LAB_00158193:
      uVar12 = (ulong)i;
      if (bVar6) {
        uVar12 = i_00;
      }
      if (!bVar4) {
        auVar20._8_4_ = (int)(uVar12 >> 0x20);
        auVar20._0_8_ = uVar12;
        auVar20._12_4_ = 0x45300000;
        dVar21 = (auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
        bVar4 = true;
      }
      bVar9 = *pbVar16;
      pbVar16 = pbVar16 + (bVar9 == 0x2b);
      bVar17 = false;
      if (bVar9 != 0x2b) {
        bVar17 = *pbVar16 == 0x2d;
        pbVar16 = pbVar16 + bVar17;
      }
      bVar9 = *pbVar16;
      if ((byte)(bVar9 - 0x30) < 10) {
        pbVar16 = pbVar16 + 1;
        iVar10 = bVar9 - 0x30;
        if (bVar17) {
          bVar9 = *pbVar16;
          if ((byte)(bVar9 - 0x30) < 10) {
            do {
              iVar10 = (uint)bVar9 + iVar10 * 10 + -0x30;
              if ((iVar14 + 0x7ffffff7) / 10 < iVar10) {
                do {
                  pbVar15 = pbVar16 + 1;
                  pbVar16 = pbVar16 + 1;
                } while ((byte)(*pbVar15 - 0x30) < 10);
              }
              else {
                pbVar16 = pbVar16 + 1;
              }
              bVar9 = *pbVar16;
            } while ((byte)(bVar9 - 0x30) < 10);
          }
        }
        else {
          do {
            bVar9 = *pbVar16;
            bVar13 = bVar9 - 0x30;
            if (9 < bVar13) goto LAB_001582be;
            pbVar16 = pbVar16 + 1;
            iVar10 = (uint)bVar9 + iVar10 * 10 + -0x30;
          } while (iVar10 <= 0x134 - iVar14);
          *(undefined4 *)(this + 0x30) = 0xd;
          *(long *)(this + 0x38) = lVar8;
LAB_001582be:
          if (bVar13 < 10) {
            bVar17 = false;
            goto LAB_001582de;
          }
        }
        iVar5 = -iVar10;
        if (!bVar17) {
          iVar5 = iVar10;
        }
        iVar10 = iVar5;
        bVar17 = true;
      }
      else {
        *(undefined4 *)(this + 0x30) = 0xf;
        *(long *)(this + 0x38) = (long)pbVar16 - (long)pCVar3;
        bVar17 = false;
        iVar10 = 0;
      }
LAB_001582de:
      if (!bVar17) goto LAB_001583de;
    }
    else {
      bVar9 = *pbVar16;
      pbVar16 = pbVar16 + (bVar9 == 0x45);
      iVar10 = 0;
      if (bVar9 == 0x45) goto LAB_00158193;
    }
    if (bVar4) {
      uVar11 = iVar10 + iVar14;
      if ((int)uVar11 < -0x134) {
        d = 0.0;
        if (-0x269 < (int)uVar11) {
          d = dVar21 / (*(double *)(internal::Pow10(int)::e + (ulong)(-uVar11 - 0x134) * 8) * 1e+308
                       );
        }
      }
      else if ((int)uVar11 < 0) {
        d = dVar21 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar11 * 8);
      }
      else {
        d = dVar21 * *(double *)(internal::Pow10(int)::e + (ulong)uVar11 * 8);
      }
      if (d <= 1.79769313486232e+308) {
        if (cVar1 == '-') {
          d = -d;
        }
        bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Double(handler,d);
        goto LAB_001583d4;
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar8;
      bVar4 = true;
      bVar6 = true;
    }
    else {
      if (bVar6) {
        if (cVar1 == '-') {
          bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Int64(handler,-i_00);
        }
        else {
          bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Uint64(handler,i_00);
        }
      }
      else if (cVar1 == '-') {
        bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int(handler,-i);
      }
      else {
        bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint(handler,i);
      }
LAB_001583d4:
      bVar4 = false;
    }
    if ((bVar4) || (bVar6 != false)) goto LAB_001583de;
    uVar7 = 0x10;
  }
LAB_0015844e:
  *(undefined4 *)(this + 0x30) = uVar7;
  *(long *)(this + 0x38) = lVar8;
LAB_001583de:
  is->src_ = (Ch *)pbVar16;
  is->head_ = pCVar3;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }